

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.h
# Opt level: O0

LIndex __thiscall
PlanningUnitMADPDiscrete::GetFirstObservationHistoryIndex
          (PlanningUnitMADPDiscrete *this,Index agI,Index ts)

{
  const_reference pvVar1;
  undefined4 in_EDX;
  undefined4 in_ESI;
  size_type in_stack_ffffffffffffffe8;
  
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::at((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
        *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffe8);
  pvVar1 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::at
                     ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                      CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffe8);
  return *pvVar1;
}

Assistant:

LIndex GetFirstObservationHistoryIndex(Index agI, Index ts) const
        {return _m_firstOHIforT.at(agI).at(ts);}